

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_freeaddrinfo.c
# Opt level: O0

void ares_freeaddrinfo_nodes(ares_addrinfo_node *head)

{
  ares_addrinfo_node *paVar1;
  ares_addrinfo_node *current;
  ares_addrinfo_node *head_local;
  
  current = head;
  while (current != (ares_addrinfo_node *)0x0) {
    paVar1 = current->ai_next;
    ares_free(current->ai_addr);
    ares_free(current);
    current = paVar1;
  }
  return;
}

Assistant:

void ares_freeaddrinfo_nodes(struct ares_addrinfo_node *head)
{
  struct ares_addrinfo_node *current;
  while (head) {
    current = head;
    head    = head->ai_next;
    ares_free(current->ai_addr);
    ares_free(current);
  }
}